

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaTypePtr *ppxVar1;
  xmlSchemaTypeType xVar2;
  xmlSchemaContentType xVar3;
  xmlSchemaTypePtr pxVar4;
  xmlSchemaTypePtr pxVar5;
  undefined8 *puVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  xmlSchemaParserCtxtPtr item;
  xmlChar *pxVar14;
  xmlChar *pxVar15;
  xmlChar *str3;
  xmlNodePtr pxVar16;
  long *payload;
  xmlHashTablePtr pxVar17;
  xmlSchemaItemListPtr pxVar18;
  xmlSchemaParserCtxtPtr pxVar19;
  xmlSchemaParserCtxtPtr type;
  xmlSchemaElementPtr head_1;
  _xmlSchemaElement *p_Var20;
  xmlSchemaTypeType xVar21;
  xmlParserErrors error;
  xmlSchemaParserCtxtPtr pxVar22;
  xmlSchemaTypePtr pxVar23;
  char *in_R8;
  char *pcVar24;
  xmlSchemaTypePtr pxVar25;
  xmlSchemaElementPtr head;
  xmlChar *local_50;
  xmlChar *local_48;
  xmlSchemaParserCtxtPtr local_40;
  xmlChar *local_38;
  
  if (elemDecl == (xmlSchemaElementPtr)0x0) {
    return;
  }
  if (((uint)elemDecl->flags >> 0x12 & 1) != 0) {
    return;
  }
  elemDecl->flags = elemDecl->flags | 0x40000;
  type = (xmlSchemaParserCtxtPtr)elemDecl->subtypes;
  pxVar19 = (xmlSchemaParserCtxtPtr)elemDecl->refDecl;
  pxVar22 = ctxt;
  if (pxVar19 == (xmlSchemaParserCtxtPtr)0x0) {
    iVar13 = 0;
  }
  else {
    xmlSchemaCheckElementDeclComponent((xmlSchemaElementPtr)pxVar19,ctxt);
    iVar13 = 0;
    if ((elemDecl->flags & 2) == 0) {
      in_R8 = "Only global element declarations can have a substitution group affiliation";
      iVar13 = 0xbe6;
      pxVar22 = (xmlSchemaParserCtxtPtr)0xbe6;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_3,(xmlSchemaBasicItemPtr)elemDecl,(xmlNodePtr)0x0,
                 "Only global element declarations can have a substitution group affiliation",
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    item = pxVar19;
    local_40 = type;
    if ((pxVar19 == (xmlSchemaParserCtxtPtr)elemDecl) ||
       (((_xmlSchemaElement *)pxVar19->dict != (_xmlSchemaElement *)0x0 &&
        (pxVar22 = pxVar19,
        item = (xmlSchemaParserCtxtPtr)
               xmlSchemaCheckSubstGroupCircular
                         ((xmlSchemaElementPtr)pxVar19,(xmlSchemaElementPtr)pxVar19),
        item != (xmlSchemaParserCtxtPtr)0x0)))) {
      local_48 = (xmlChar *)0x0;
      local_50 = (xmlChar *)0x0;
      pxVar14 = xmlSchemaGetComponentQName(&local_48,item);
      pxVar15 = xmlSchemaGetComponentQName(&local_50,pxVar19);
      in_R8 = 
      "The element declaration \'%s\' defines a circular substitution group to element declaration \'%s\'"
      ;
      pxVar22 = (xmlSchemaParserCtxtPtr)0xbe9;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_6,(xmlSchemaBasicItemPtr)item,(xmlNodePtr)0x0,
                 "The element declaration \'%s\' defines a circular substitution group to element declaration \'%s\'"
                 ,pxVar14,pxVar15,(xmlChar *)0x0);
      if (local_48 != (xmlChar *)0x0) {
        (*xmlFree)(local_48);
      }
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
      }
      iVar13 = 0xbe9;
      type = local_40;
    }
    if ((type != (xmlSchemaParserCtxtPtr)elemDecl->refDecl->subtypes) &&
       (pxVar22 = type,
       iVar11 = xmlSchemaCheckCOSDerivedOK
                          ((xmlSchemaAbstractCtxtPtr)ctxt,(xmlSchemaTypePtr)type,
                           *(xmlSchemaTypePtr *)&pxVar19->ownsConstructor,
                           *(uint *)&pxVar19->doc >> 0x10 & 1 | *(uint *)&pxVar19->doc >> 0xe & 2),
       iVar11 != 0)) {
      local_48 = (xmlChar *)0x0;
      local_50 = (xmlChar *)0x0;
      local_38 = (xmlChar *)0x0;
      pxVar14 = xmlSchemaGetComponentQName(&local_48,type);
      pxVar15 = xmlSchemaGetComponentQName(&local_50,pxVar19);
      str3 = xmlSchemaGetComponentQName(&local_38,*(xmlSchemaTypePtr *)&pxVar19->ownsConstructor);
      in_R8 = 
      "The type definition \'%s\' was either rejected by the substitution group affiliation \'%s\', or not validly derived from its type definition \'%s\'"
      ;
      pxVar22 = (xmlSchemaParserCtxtPtr)0xbe7;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_4,(xmlSchemaBasicItemPtr)elemDecl,(xmlNodePtr)0x0,
                 "The type definition \'%s\' was either rejected by the substitution group affiliation \'%s\', or not validly derived from its type definition \'%s\'"
                 ,pxVar14,pxVar15,str3);
      if (local_48 != (xmlChar *)0x0) {
        (*xmlFree)(local_48);
      }
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
      }
      type = local_40;
      if (local_38 != (xmlChar *)0x0) {
        (*xmlFree)(local_38);
      }
      iVar13 = 0xbe7;
    }
  }
  xVar21 = (xmlSchemaTypeType)pxVar22;
  if (elemDecl->value == (xmlChar *)0x0) {
LAB_001a1ea4:
    if (iVar13 != 0) {
      return;
    }
LAB_001a1ee4:
    p_Var20 = elemDecl->refDecl;
    if ((p_Var20 != (_xmlSchemaElement *)0x0) && ((elemDecl->flags & 0x10) == 0)) {
      do {
        if (((uint)p_Var20->flags >> 0xd & 1) == 0) {
          pxVar4 = p_Var20->subtypes;
          pxVar23 = elemDecl->subtypes;
          if (pxVar4 != pxVar23) {
            bVar8 = false;
            bVar9 = false;
            pxVar25 = pxVar23;
            if (pxVar23 != (xmlSchemaTypePtr)0x0) {
              while (pxVar5 = pxVar25->baseType, in_R8 = (char *)pxVar25, pxVar25 != pxVar5) {
                uVar12 = pxVar25->flags;
                bVar10 = true;
                if (bVar9) {
                  bVar10 = bVar8;
                }
                if ((uVar12 & 2) == 0) {
                  bVar10 = bVar8;
                }
                bVar8 = bVar10;
                bVar10 = true;
                if (bVar9) {
                  bVar10 = bVar9;
                }
                if ((uVar12 & 4) == 0) {
                  bVar10 = bVar9;
                }
                bVar9 = bVar10;
                in_R8 = (char *)(ulong)uVar12;
                if ((pxVar5 == (xmlSchemaTypePtr)0x0) ||
                   (in_R8 = (char *)pxVar5, pxVar25 = pxVar5, pxVar5 == pxVar4)) break;
              }
            }
            uVar12 = (p_Var20->flags & 0x1800U) << 7;
            do {
              pxVar23 = pxVar23->baseType;
              if ((pxVar23 == (xmlSchemaTypePtr)0x0) ||
                 ((pxVar23->type != 5 && (pxVar23->builtInType != 0x2d)))) break;
              uVar7 = uVar12 | 0x40000;
              if ((uVar12 >> 0x12 & 1) != 0) {
                uVar7 = uVar12;
              }
              if ((pxVar23->flags & 0x40000U) == 0) {
                uVar7 = uVar12;
              }
              in_R8 = (char *)(ulong)uVar7;
              uVar12 = uVar7 | 0x80000;
              if (uVar7 >> 0x13 != 0) {
                uVar12 = uVar7;
              }
              if ((pxVar23->flags & 0x80000U) == 0) {
                uVar12 = uVar7;
              }
            } while (pxVar23 != pxVar4);
            if ((uVar12 != 0) &&
               ((((uVar12 >> 0x12 & 1) != 0 && (bVar8)) || ((uVar12 >> 0x13 != 0 && (bVar9))))))
            goto LAB_001a2151;
          }
          pxVar17 = ctxt->constructor->substGroups;
          if (pxVar17 == (xmlHashTablePtr)0x0) {
LAB_001a204b:
            pxVar17 = xmlHashCreateDict(10,ctxt->dict);
            ctxt->constructor->substGroups = pxVar17;
            if (pxVar17 != (xmlHashTablePtr)0x0) {
LAB_001a206d:
              payload = (long *)(*xmlMalloc)(0x10);
              if (payload == (long *)0x0) {
                in_R8 = (char *)0x0;
                xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0
                                    ,0x10,(xmlError *)0x0);
              }
              else {
                payload[1] = 0;
                *payload = (long)p_Var20;
                pxVar18 = xmlSchemaItemListCreate();
                payload[1] = (long)pxVar18;
                if (pxVar18 == (xmlSchemaItemListPtr)0x0) {
                  (*xmlFree)(payload);
                }
                else {
                  iVar13 = xmlHashAddEntry2(ctxt->constructor->substGroups,p_Var20->name,
                                            p_Var20->targetNamespace,payload);
                  if (iVar13 == 0) goto LAB_001a202a;
                  xmlSchemaInternalErr2
                            ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaSubstGroupAdd",
                             "failed to add a new substitution container",(xmlChar *)0x0,
                             (xmlChar *)in_R8);
                  puVar6 = (undefined8 *)payload[1];
                  if (puVar6 != (undefined8 *)0x0) {
                    if ((void *)*puVar6 != (void *)0x0) {
                      (*xmlFree)((void *)*puVar6);
                    }
                    (*xmlFree)(puVar6);
                  }
                  (*xmlFree)(payload);
                }
              }
            }
          }
          else {
            payload = (long *)xmlHashLookup2(pxVar17,p_Var20->name,p_Var20->targetNamespace);
            if (payload == (long *)0x0) {
              if (ctxt->constructor->substGroups == (xmlHashTablePtr)0x0) goto LAB_001a204b;
              goto LAB_001a206d;
            }
LAB_001a202a:
            xmlSchemaItemListAddSize((xmlSchemaItemListPtr)payload[1],0x14,elemDecl);
          }
          if (((uint)p_Var20->flags >> 0x11 & 1) == 0) {
            p_Var20->flags = p_Var20->flags | 0x20000;
          }
        }
LAB_001a2151:
        p_Var20 = p_Var20->refDecl;
      } while (p_Var20 != (_xmlSchemaElement *)0x0);
    }
  }
  else {
    xVar2 = type->type;
    if (xVar2 == XML_SCHEMA_TYPE_COMPLEX) {
LAB_001a1da9:
      if (((*(xmlSchemaContentType *)((long)&type->doc + 4) | XML_SCHEMA_CONTENT_ELEMENTS) !=
           XML_SCHEMA_CONTENT_BASIC) ||
         (iVar11 = xmlSchemaIsDerivedFromBuiltInType(*(xmlSchemaTypePtr *)&type->xsiAssemble,xVar21)
         , iVar11 == 0)) goto LAB_001a1de5;
LAB_001a1dc5:
      pcVar24 = 
      "The type definition (or type definition\'s content type) is or is derived from ID; value constraints are not allowed in conjunction with such a type definition"
      ;
      error = XML_SCHEMAP_E_PROPS_CORRECT_5;
      pxVar16 = (xmlNodePtr)0x0;
      type = (xmlSchemaParserCtxtPtr)elemDecl;
    }
    else {
      pxVar19 = type;
      if ((xVar2 == XML_SCHEMA_TYPE_SIMPLE) ||
         ((xVar2 == XML_SCHEMA_TYPE_BASIC && (*(int *)&type->ctxtType != 0x2d)))) {
        do {
          xVar21 = pxVar19->type;
          if ((xVar21 == XML_SCHEMA_TYPE_COMPLEX) ||
             (iVar11 = *(int *)&pxVar19->ctxtType, iVar11 == 0x2d)) break;
          if (xVar21 == XML_SCHEMA_TYPE_BASIC) {
            if (iVar11 == 0x17) goto LAB_001a1dc5;
            if (iVar11 == 0x2e) break;
          }
          ppxVar1 = (xmlSchemaTypePtr *)&pxVar19->ownsConstructor;
          pxVar19 = (xmlSchemaParserCtxtPtr)*ppxVar1;
        } while ((xmlSchemaParserCtxtPtr)*ppxVar1 != (xmlSchemaParserCtxtPtr)0x0);
        if (xVar2 == XML_SCHEMA_TYPE_COMPLEX) goto LAB_001a1da9;
      }
      if (*(int *)&type->ctxtType == 0x2d) goto LAB_001a1da9;
LAB_001a1de5:
      if (elemDecl->node == (xmlNode *)0x0) {
        pxVar16 = (xmlNodePtr)0x0;
      }
      else {
        pcVar24 = "fixed";
        if ((elemDecl->flags & 8) == 0) {
          pcVar24 = "default";
        }
        pxVar16 = (xmlNodePtr)xmlHasProp(elemDecl->node,(xmlChar *)pcVar24);
      }
      pxVar14 = elemDecl->value;
      xVar21 = type->type;
      if (((((xVar21 != XML_SCHEMA_TYPE_COMPLEX) && (*(int *)&type->ctxtType != 0x2d)) ||
           (xVar3 = *(xmlSchemaContentType *)((long)&type->doc + 4),
           xVar3 == XML_SCHEMA_CONTENT_BASIC)) || (xVar3 == XML_SCHEMA_CONTENT_SIMPLE)) ||
         ((xVar3 == XML_SCHEMA_CONTENT_MIXED &&
          (iVar11 = xmlSchemaIsParticleEmptiable
                              ((xmlSchemaParticlePtr)*(xmlSchemaTypePtr *)&type->ownsConstructor),
          iVar11 != 0)))) {
        in_R8 = (char *)&elemDecl->defVal;
        if ((xVar21 != XML_SCHEMA_TYPE_SIMPLE) &&
           ((xVar21 != XML_SCHEMA_TYPE_BASIC || (*(int *)&type->ctxtType == 0x2d)))) {
          if ((*(xmlSchemaContentType *)((long)&type->doc + 4) | XML_SCHEMA_CONTENT_ELEMENTS) !=
              XML_SCHEMA_CONTENT_BASIC) goto LAB_001a1ea4;
          type = *(xmlSchemaParserCtxtPtr *)&type->xsiAssemble;
        }
        iVar11 = xmlSchemaVCheckCVCSimpleType
                           ((xmlSchemaAbstractCtxtPtr)ctxt,pxVar16,(xmlSchemaTypePtr)type,pxVar14,
                            (xmlSchemaValPtr *)in_R8,1,1,0);
        if (iVar11 < 0) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaParseCheckCOSValidDefault",
                     "calling xmlSchemaVCheckCVCSimpleType()",(xmlChar *)0x0,(xmlChar *)in_R8);
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaElemCheckValConstr",
                     "failed to validate the value constraint of an element declaration",
                     (xmlChar *)0x0,(xmlChar *)in_R8);
          return;
        }
        if (iVar11 != 0 || iVar13 != 0) {
          return;
        }
        goto LAB_001a1ee4;
      }
      pxVar16 = *(xmlNodePtr *)&type->counter;
      pcVar24 = 
      "For a string to be a valid default, the type definition must be a simple type or a complex type with mixed content and a particle emptiable"
      ;
      error = XML_SCHEMAP_COS_VALID_DEFAULT_2_1;
    }
    xmlSchemaPCustomErrExt
              (ctxt,error,(xmlSchemaBasicItemPtr)type,pxVar16,pcVar24,(xmlChar *)0x0,(xmlChar *)0x0,
               (xmlChar *)0x0);
  }
  return;
}

Assistant:

static void
xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,
				   xmlSchemaParserCtxtPtr ctxt)
{
    if (elemDecl == NULL)
	return;
    if (elemDecl->flags & XML_SCHEMAS_ELEM_INTERNAL_CHECKED)
	return;
    elemDecl->flags |= XML_SCHEMAS_ELEM_INTERNAL_CHECKED;
    if (xmlSchemaCheckElemPropsCorrect(ctxt, elemDecl) == 0) {
	/*
	* Adds substitution group members.
	*/
	xmlSchemaCheckElemSubstGroup(ctxt, elemDecl);
    }
}